

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O3

char16_t * PAL_wcscat(char16_t *strDestination,char16_t *strSource)

{
  long lVar1;
  size_t sVar2;
  char16_t *pcVar3;
  size_t count;
  
  if (PAL_InitializeChakraCoreCalled) {
    if ((strSource == (char16_t *)0x0) || (*strSource == L'\0')) {
      count = 0;
    }
    else {
      sVar2 = 0;
      do {
        count = sVar2 + 1;
        lVar1 = sVar2 + 1;
        sVar2 = count;
      } while (strSource[lVar1] != L'\0');
    }
    pcVar3 = PAL_wcsncat(strDestination,strSource,count);
    if (PAL_InitializeChakraCoreCalled != false) {
      return pcVar3;
    }
  }
  abort();
}

Assistant:

char16_t *
__cdecl
PAL_wcscat(
        char16_t *strDestination,
        const char16_t *strSource)
{
    char16_t *ret;
    PERF_ENTRY(wcscat);
    ENTRY("wcscat (strDestination=%p (%S), strSource=%p (%S))\n",
          strDestination?strDestination:W16_NULLSTRING,
          strDestination?strDestination:W16_NULLSTRING, strSource?strSource:W16_NULLSTRING, strSource?strSource:W16_NULLSTRING);

    ret = PAL_wcsncat( strDestination, strSource, PAL_wcslen( strSource ) );

    LOGEXIT("wcscat returning char16_t %p (%S)\n", ret, ret);
    PERF_EXIT(wcscat);
    return ret;
}